

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

int32 vector_cmp(float32 *v1,float32 *v2,int32 len)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = 0;
  }
  uVar4 = 0;
  while( true ) {
    if (uVar3 == uVar4) {
      return 0;
    }
    pfVar1 = (float *)(v1 + uVar4);
    pfVar2 = (float *)(v2 + uVar4);
    if (*pfVar1 < *pfVar2) break;
    uVar4 = uVar4 + 1;
    if (*pfVar2 < *pfVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

int32
vector_cmp(float32 * v1, float32 * v2, int32 len)
{
    int32 i;

    for (i = 0; i < len; i++) {
        if (v1[i] < v2[i])
            return -1;
        if (v1[i] > v2[i])
            return 1;
    }

    return 0;
}